

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  pointer pMVar2;
  size_t _elemsize;
  Mat *pMVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  size_t b_2;
  void *pvVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  size_t b_4;
  long lVar12;
  size_t b;
  ulong uVar13;
  void *pvVar14;
  bool bVar15;
  int local_b0;
  Mat local_70;
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = pMVar2->dims;
  _elemsize = pMVar2->elemsize;
  if (uVar5 == 1) {
    lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
    piVar11 = &pMVar2->w;
    iVar9 = 0;
    while (bVar15 = lVar7 != 0, lVar7 = lVar7 + -1, bVar15) {
      iVar9 = iVar9 + *piVar11;
      piVar11 = piVar11 + 0x10;
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar9,_elemsize,opt->blob_allocator);
    pvVar14 = pMVar3->data;
    local_b0 = -100;
    if ((pvVar14 != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
      local_b0 = 0;
      lVar7 = 0;
      for (uVar13 = 0;
          pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar13 < (ulong)((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
          uVar13 = uVar13 + 1) {
        lVar12 = (long)*(int *)((long)&pMVar2->w + lVar7);
        memcpy(pvVar14,*(void **)((long)&pMVar2->data + lVar7),_elemsize * lVar12);
        pvVar14 = (void *)((long)pvVar14 + lVar12 * 4);
        lVar7 = lVar7 + 0x40;
      }
    }
  }
  else {
    uVar1 = this->axis;
    if ((uVar5 ^ 2) == 0 && uVar1 == 0) {
      iVar9 = pMVar2->w;
      lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
      piVar11 = &pMVar2->h;
      iVar4 = 0;
      while (bVar15 = lVar7 != 0, lVar7 = lVar7 + -1, bVar15) {
        iVar4 = iVar4 + *piVar11;
        piVar11 = piVar11 + 0x10;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar9,iVar4,_elemsize,opt->blob_allocator);
      pvVar14 = pMVar3->data;
      local_b0 = -100;
      if ((pvVar14 != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_b0 = 0;
        lVar7 = 0;
        for (uVar13 = 0;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar13 < (ulong)((long)(bottom_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
            uVar13 = uVar13 + 1) {
          lVar12 = (long)*(int *)((long)&pMVar2->h + lVar7) * (long)iVar9;
          memcpy(pvVar14,*(void **)((long)&pMVar2->data + lVar7),_elemsize * lVar12);
          pvVar14 = (void *)((long)pvVar14 + lVar12 * 4);
          lVar7 = lVar7 + 0x40;
        }
      }
    }
    else if ((uVar5 ^ 2) == 0 && (uVar1 ^ 1) == 0) {
      iVar9 = pMVar2->h;
      lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
      piVar11 = &pMVar2->w;
      iVar4 = 0;
      while (bVar15 = lVar7 != 0, lVar7 = lVar7 + -1, bVar15) {
        iVar4 = iVar4 + *piVar11;
        piVar11 = piVar11 + 0x10;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar4,iVar9,_elemsize,opt->blob_allocator);
      local_b0 = -100;
      if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_b0 = 0;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        for (iVar4 = 0; iVar4 != iVar9; iVar4 = iVar4 + 1) {
          pvVar14 = (void *)((long)pMVar3->w * (long)iVar4 * pMVar3->elemsize + (long)pMVar3->data);
          lVar7 = 0x2c;
          for (uVar13 = 0;
              pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
              uVar13 < (ulong)((long)(bottom_blobs->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
              uVar13 = uVar13 + 1) {
            lVar12 = (long)*(int *)((long)&pMVar2->data + lVar7);
            memcpy(pvVar14,(void *)(lVar12 * iVar4 * *(long *)((long)pMVar2 + lVar7 + -0x1c) +
                                   *(long *)((long)pMVar2 + lVar7 + -0x2c)),lVar12 * _elemsize);
            pvVar14 = (void *)((long)pvVar14 + (long)*(int *)((long)&pMVar2->data + lVar7) * 4);
            lVar7 = lVar7 + 0x40;
          }
        }
      }
    }
    else {
      uVar5 = uVar5 ^ 3;
      if (uVar5 == 0 && uVar1 == 0) {
        lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
        piVar11 = &pMVar2->c;
        iVar9 = 0;
        while (bVar15 = lVar7 != 0, lVar7 = lVar7 + -1, bVar15) {
          iVar9 = iVar9 + *piVar11;
          piVar11 = piVar11 + 0x10;
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,pMVar2->w,pMVar2->h,iVar9,_elemsize,opt->blob_allocator);
        local_b0 = -100;
        if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
          local_b0 = 0;
          lVar7 = 0x38;
          iVar9 = 0;
          for (uVar13 = 0;
              pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
              uVar13 < (ulong)((long)(bottom_blobs->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
              uVar13 = uVar13 + 1) {
            iVar4 = *(int *)((long)pMVar2 + lVar7 + -4);
            iVar10 = *(int *)((long)&pMVar2->data + lVar7);
            pvVar14 = *(void **)((long)pMVar2 + lVar7 + -0x38);
            Mat::channel(&local_70,pMVar3,iVar9);
            pvVar8 = local_70.data;
            Mat::~Mat(&local_70);
            memcpy(pvVar8,pvVar14,(long)(iVar10 * iVar4) * _elemsize);
            iVar9 = iVar9 + iVar4;
            lVar7 = lVar7 + 0x40;
          }
        }
      }
      else if ((uVar1 ^ 1) == 0 && uVar5 == 0) {
        iVar9 = pMVar2->c;
        lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
        piVar11 = &pMVar2->h;
        iVar4 = 0;
        while (bVar15 = lVar7 != 0, lVar7 = lVar7 + -1, bVar15) {
          iVar4 = iVar4 + *piVar11;
          piVar11 = piVar11 + 0x10;
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,pMVar2->w,iVar4,iVar9,_elemsize,opt->blob_allocator);
        local_b0 = -100;
        if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
          local_b0 = 0;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          for (iVar4 = 0; iVar4 != iVar9; iVar4 = iVar4 + 1) {
            Mat::channel(&local_70,pMVar3,iVar4);
            pvVar14 = local_70.data;
            Mat::~Mat(&local_70);
            lVar7 = 0;
            for (uVar13 = 0;
                pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                uVar13 < (ulong)((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6
                                ); uVar13 = uVar13 + 1) {
              lVar12 = (long)*(int *)((long)&pMVar2->h + lVar7) *
                       (long)*(int *)((long)&pMVar2->w + lVar7);
              Mat::channel(&local_70,(Mat *)((long)&pMVar2->data + lVar7),iVar4);
              pvVar8 = local_70.data;
              Mat::~Mat(&local_70);
              memcpy(pvVar14,pvVar8,_elemsize * lVar12);
              pvVar14 = (void *)((long)pvVar14 + lVar12 * 4);
              lVar7 = lVar7 + 0x40;
            }
          }
        }
      }
      else {
        local_b0 = 0;
        if (uVar5 == 0 && uVar1 == 2) {
          iVar9 = pMVar2->h;
          iVar4 = pMVar2->c;
          lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
          piVar11 = &pMVar2->w;
          iVar10 = 0;
          while (bVar15 = lVar7 != 0, lVar7 = lVar7 + -1, bVar15) {
            iVar10 = iVar10 + *piVar11;
            piVar11 = piVar11 + 0x10;
          }
          pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          Mat::create(pMVar3,iVar10,iVar9,iVar4,_elemsize,opt->blob_allocator);
          local_b0 = -100;
          if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
            if (iVar9 < 1) {
              iVar9 = 0;
            }
            local_b0 = 0;
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            for (iVar10 = 0; iVar10 != iVar4; iVar10 = iVar10 + 1) {
              Mat::channel(&local_70,pMVar3,iVar10);
              pvVar14 = local_70.data;
              Mat::~Mat(&local_70);
              for (iVar6 = 0; iVar6 != iVar9; iVar6 = iVar6 + 1) {
                lVar7 = 0;
                for (uVar13 = 0;
                    pMVar2 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_start,
                    uVar13 < (ulong)((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar2 >> 6); uVar13 = uVar13 + 1) {
                  Mat::channel(&local_70,(Mat *)((long)&pMVar2->data + lVar7),iVar10);
                  pvVar8 = (void *)((long)local_70.w * (long)iVar6 * local_70.elemsize +
                                   (long)local_70.data);
                  Mat::~Mat(&local_70);
                  memcpy(pvVar14,pvVar8,(long)*(int *)((long)&pMVar2->w + lVar7) * _elemsize);
                  pvVar14 = (void *)((long)pvVar14 + (long)*(int *)((long)&pMVar2->w + lVar7) * 4);
                  lVar7 = lVar7 + 0x40;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_b0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            int size = bottom_blob.cstep * channels;

            const float* ptr = bottom_blob;
            float* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w;
                }
            }
        }

        return 0;
    }

    return 0;
}